

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O1

int __thiscall anon_unknown.dwarf_28c34e::SndioPlayback::mixerProc(SndioPlayback *this)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  pointer outBuffer;
  sio_par par;
  undefined1 local_70 [4];
  uint local_6c;
  uint local_58;
  
  sio_initpar(local_70);
  iVar1 = sio_getpar(this->mSndHandle,local_70);
  if (iVar1 == 0) {
    ALCdevice::handleDisconnect((this->super_BackendBase).mDevice,"Failed to get device parameters")
    ;
    iVar1 = 1;
  }
  else {
    SetRTPriority();
    althrd_setname("alsoft-mixer");
    iVar1 = 0;
    if (((this->mKillNow)._M_base._M_i & 1U) == 0) {
      do {
        if (((((this->super_BackendBase).mDevice)->Connected)._M_base._M_i & 1U) == 0) break;
        outBuffer = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        uVar3 = (long)(this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)outBuffer;
        ALCdevice::renderSamples
                  ((this->super_BackendBase).mDevice,outBuffer,
                   (ALuint)((uVar3 & 0xffffffff) / ((ulong)local_6c * (ulong)local_58)),
                   (ulong)local_58);
        do {
          if ((uVar3 == 0) || (((this->mKillNow)._M_base._M_i & 1U) != 0)) break;
          lVar2 = sio_write(this->mSndHandle,outBuffer,uVar3);
          if (lVar2 == 0) {
            if (0 < (int)gLogLevel) {
              _GLOBAL__N_1::SndioPlayback::mixerProc();
            }
            ALCdevice::handleDisconnect
                      ((this->super_BackendBase).mDevice,"Failed to write playback samples");
          }
          else {
            uVar3 = uVar3 - lVar2;
            outBuffer = outBuffer + lVar2;
          }
        } while (lVar2 != 0);
      } while (((this->mKillNow)._M_base._M_i & 1U) == 0);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int SndioPlayback::mixerProc()
{
    sio_par par;
    sio_initpar(&par);
    if(!sio_getpar(mSndHandle, &par))
    {
        mDevice->handleDisconnect("Failed to get device parameters");
        return 1;
    }

    const size_t frameStep{par.pchan};
    const size_t frameSize{frameStep * par.bps};

    SetRTPriority();
    althrd_setname(MIXER_THREAD_NAME);

    while(!mKillNow.load(std::memory_order_acquire)
        && mDevice->Connected.load(std::memory_order_acquire))
    {
        al::byte *WritePtr{mBuffer.data()};
        size_t len{mBuffer.size()};

        mDevice->renderSamples(WritePtr, static_cast<ALuint>(len)/frameSize, frameStep);
        while(len > 0 && !mKillNow.load(std::memory_order_acquire))
        {
            size_t wrote{sio_write(mSndHandle, WritePtr, len)};
            if(wrote == 0)
            {
                ERR("sio_write failed\n");
                mDevice->handleDisconnect("Failed to write playback samples");
                break;
            }

            len -= wrote;
            WritePtr += wrote;
        }
    }

    return 0;
}